

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

Variable * __thiscall
soul::BlockBuilder::createMutableLocalVariable(BlockBuilder *this,Type *type,string *name)

{
  Variable *pVVar1;
  string_view newString;
  Type local_28;
  Identifier local_10;
  
  local_28.category = type->category;
  local_28.arrayElementCategory = type->arrayElementCategory;
  local_28.isRef = type->isRef;
  local_28.isConstant = type->isConstant;
  local_28.primitiveType.type = (type->primitiveType).type;
  local_28.boundingSize = type->boundingSize;
  local_28.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_28.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  newString._M_str = (name->_M_dataplus)._M_p;
  newString._M_len = name->_M_string_length;
  local_10 = Identifier::Pool::get(&this->module->allocator->identifiers,newString);
  pVVar1 = createVariable<soul::Identifier>(this,&local_28,&local_10,mutableLocal);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  return pVVar1;
}

Assistant:

heart::Variable& createMutableLocalVariable (Type type, std::string name)
    {
        return createVariable (std::move (type), createIdentifier (std::move (name)), heart::Variable::Role::mutableLocal);
    }